

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

void run_sender(_Bool *err)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  bool start_00;
  undefined4 local_40c;
  char local_408 [8];
  char buffer [1002];
  _Bool local_16;
  _Bool halt;
  _Bool start;
  int tmp_err;
  _Bool *err_local;
  
  local_16 = false;
  do {
    pcVar3 = fgets(local_408,0x3ea,_stdin);
    if (pcVar3 == (char *)0x0) break;
    sVar4 = strlen(local_408);
    local_408[sVar4 - 1] = '\0';
    start_00 = local_408[0] != '!';
    local_16 = (_Bool)((start_00 ^ 0xffU) & 1);
    uVar1 = getpid();
    log_formatted("%d SND: %s, start=%d, halt=%d",(ulong)uVar1,local_408,(ulong)start_00,
                  (ulong)local_16);
    validator_mq_send(validator_mq,start_00,local_16,local_16,false,false,main_pid,local_408,err);
    if ((*err & 1U) != 0) {
      if (err != (_Bool *)0x0) {
        *err = true;
      }
      log_formatted("Fail in %s, function: %s",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                    ,"run_sender");
      return;
    }
    if (local_16 == false) {
      local_40c = main_pid;
      iVar2 = __libc_current_sigrtmin();
      iVar2 = kill(local_40c,iVar2 + 1);
      if (iVar2 == -1) {
        if (err != (_Bool *)0x0) {
          *err = true;
        }
        log_formatted("Fail in %s, function: %s",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                      ,"run_sender");
        return;
      }
    }
    local_408[0] = '\0';
  } while (local_16 == false);
  if ((local_16 == false) &&
     (validator_mq_send(validator_mq,false,false,true,false,false,main_pid,local_408,err),
     (*err & 1U) != 0)) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                  ,"run_sender");
  }
  return;
}

Assistant:

static void run_sender(bool *err) {
    int tmp_err = 0;
    bool start = true;
    bool halt = !start;
    char buffer[WORD_LEN_MAX+2]; // + '\n' and '\0'
    while(fgets(buffer, sizeof(buffer), stdin) != NULL) {
        assert(buffer[strlen(buffer)-1] == '\n');

        buffer[strlen(buffer)-1] = '\0';
        start = (buffer[0]!='!');
        halt = !start;

        log_formatted("%d SND: %s, start=%d, halt=%d", getpid(), buffer, start, halt);
        validator_mq_send(validator_mq, start, halt, halt, false, false, main_pid, buffer, err); // halt => completed
        VOID_FAIL_IF(*err); // pass error further

        if(!halt) {
            tmp_err = kill(main_pid, SIG_SNT_SUCCESS);
            VOID_FAIL_IF(tmp_err == -1);
        }

        buffer[0] = '\0'; // following shorter words cannot contain junk
        if(halt) {
            break; // no point in sending extra words
        }
    }
    if(!halt) {
        // halt => completed, so there is no point in sending second completed message
        validator_mq_send(validator_mq, false, false, true, false, false, main_pid, buffer, err);
        VOID_FAIL_IF(*err); // pass error further
    }
}